

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreterProxy::sendMessage(StackInterpreterProxy *this,int argumentCount)

{
  int argumentCount_local;
  StackInterpreterProxy *this_local;
  
  StackInterpreter::sendMessage(this->interpreter,argumentCount);
  StackInterpreter::interpret(this->interpreter);
  return;
}

Assistant:

void StackInterpreterProxy::sendMessage(int argumentCount)
{
    interpreter->sendMessage(argumentCount);
    interpreter->interpret();
}